

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Accuracy::TextureCubeFilteringCase::iterate(TextureCubeFilteringCase *this)

{
  glBindTextureFunc p_Var1;
  RenderContext *context;
  TestContext *this_00;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  TestNodeType TVar5;
  int iVar6;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  char *pcVar7;
  reference ppTVar8;
  TextureCube *pTVar9;
  NotSupportedError *this_01;
  undefined4 extraout_var_01;
  PixelFormat *pPVar10;
  undefined4 extraout_var_02;
  size_type sVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int iVar12;
  string local_2e8;
  int local_2c4 [2];
  int score;
  int worstScoreDiff;
  int bestScoreDiff;
  Vector<float,_2> local_290;
  Vector<float,_2> local_288;
  Vector<float,_2> local_280;
  SurfaceAccess local_278;
  Vector<float,_2> local_258;
  Vector<float,_2> local_250;
  Vector<float,_2> local_248;
  SurfaceAccess local_240;
  Vector<float,_2> local_220;
  Vector<float,_2> local_218;
  Vector<float,_2> local_210;
  SurfaceAccess local_208;
  Vector<float,_2> local_1e8;
  Vector<float,_2> local_1e0;
  Vector<float,_2> local_1d8;
  SurfaceAccess local_1d0;
  TextureFormat local_1b0;
  Sampler local_1a8;
  int local_16c;
  int local_168;
  int curTexNdx;
  int topHeight;
  int bottomHeight;
  int rightWidth;
  int leftWidth;
  TextureFormatInfo fmtInfo;
  TextureFormat *texFmt;
  ReferenceParams sampleParams;
  undefined1 local_70 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  int local_38;
  RandomViewport viewport;
  int defViewportHeight;
  int defViewportWidth;
  int cellSize;
  TestLog *log;
  Functions *gl;
  TextureCubeFilteringCase *this_local;
  Functions *gl_00;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar7);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)((long)&renderedFrame.m_pixels.m_cap + 4),
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),0xa8,0x70,dVar4);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_70,viewport.x,viewport.y);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)&texFmt,TEXTURETYPE_CUBE);
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,0);
  pTVar9 = glu::TextureCube::getRefTexture(*ppTVar8);
  fmtInfo.lookupBias.m_data._8_8_ = tcu::TextureCube::getFormat(pTVar9);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)&rightWidth,(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_);
  TVar5 = tcu::TestNode::getNodeType((TestNode *)this);
  if ((TVar5 == NODETYPE_ACCURACY) && ((viewport.x < 0xa8 || (viewport.y < 0x70)))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
               ,0x21e);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  bottomHeight = viewport.x / 2;
  topHeight = viewport.x - bottomHeight;
  curTexNdx = viewport.y / 2;
  local_168 = viewport.y - curTexNdx;
  local_16c = 0;
  glu::mapGLSampler(&local_1a8,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
  tcu::Sampler::operator=
            ((Sampler *)(sampleParams.super_RenderParams.colorBias.m_data + 2),&local_1a8);
  sampleParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  local_1b0 = *(TextureFormat *)fmtInfo.lookupBias.m_data._8_8_;
  texFmt._4_4_ = glu::TextureTestUtil::getSamplerType(local_1b0);
  sampleParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  sampleParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  sampleParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  sampleParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  sampleParams.super_RenderParams.bias = fmtInfo.valueMax.m_data[2];
  sampleParams.super_RenderParams.ref = fmtInfo.valueMax.m_data[3];
  sampleParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  sampleParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  sampleParams.sampler.seamlessCubeMap = false;
  sampleParams.sampler._53_3_ = 0;
  (*gl_00->activeTexture)(0x84c0);
  p_Var1 = gl_00->bindTexture;
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,(long)local_16c);
  dVar4 = glu::TextureCube::getGLTexture(*ppTVar8);
  (*p_Var1)(0x8513,dVar4);
  (*gl_00->texParameteri)(0x8513,0x2802,this->m_wrapS);
  (*gl_00->texParameteri)(0x8513,0x2803,this->m_wrapT);
  (*gl_00->texParameteri)(0x8513,0x2801,this->m_minFilter);
  (*gl_00->texParameteri)(0x8513,0x2800,this->m_magFilter);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar10 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  tcu::SurfaceAccess::SurfaceAccess
            (&local_1d0,(Surface *)local_70,pPVar10,0,0,bottomHeight,curTexNdx);
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,(long)local_16c);
  pTVar9 = glu::TextureCube::getRefTexture(*ppTVar8);
  iVar6 = renderedFrame.m_pixels.m_cap._4_4_;
  iVar2 = bottomHeight;
  iVar3 = curTexNdx;
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_1d8,-0.975,-0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_1d8,-0.81,-0.81);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_1e0,0.975,0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_1e0,0.8,0.8);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_1e8,1.3,1.25);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_1e8,1.0,1.0);
  }
  renderFaces(gl_00,&local_1d0,pTVar9,(ReferenceParams *)&texFmt,&this->m_renderer,iVar6,local_38,
              iVar2,iVar3,&local_1d8,&local_1e0,&local_1e8);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar10 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess
            (&local_208,(Surface *)local_70,pPVar10,bottomHeight,0,topHeight,curTexNdx);
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,(long)local_16c);
  pTVar9 = glu::TextureCube::getRefTexture(*ppTVar8);
  iVar2 = topHeight;
  iVar3 = curTexNdx;
  iVar6 = renderedFrame.m_pixels.m_cap._4_4_ + bottomHeight;
  tcu::Vector<float,_2>::Vector(&local_210,0.5,0.65);
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_218,0.975,0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_218,0.8,0.8);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_220,1.1,1.06);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_220,1.0,1.0);
  }
  renderFaces(gl_00,&local_208,pTVar9,(ReferenceParams *)&texFmt,&this->m_renderer,iVar6,local_38,
              iVar2,iVar3,&local_210,&local_218,&local_220);
  sVar11 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::size
                     (&this->m_textures);
  if (1 < sVar11) {
    local_16c = local_16c + 1;
    p_Var1 = gl_00->bindTexture;
    ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                        (&this->m_textures,(long)local_16c);
    dVar4 = glu::TextureCube::getGLTexture(*ppTVar8);
    (*p_Var1)(0x8513,dVar4);
    (*gl_00->texParameteri)(0x8513,0x2802,this->m_wrapS);
    (*gl_00->texParameteri)(0x8513,0x2803,this->m_wrapT);
    (*gl_00->texParameteri)(0x8513,0x2801,this->m_minFilter);
    (*gl_00->texParameteri)(0x8513,0x2800,this->m_magFilter);
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar10 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_03,iVar3));
  tcu::SurfaceAccess::SurfaceAccess
            (&local_240,(Surface *)local_70,pPVar10,0,curTexNdx,bottomHeight,local_168);
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,(long)local_16c);
  pTVar9 = glu::TextureCube::getRefTexture(*ppTVar8);
  iVar6 = renderedFrame.m_pixels.m_cap._4_4_;
  iVar2 = bottomHeight;
  iVar3 = local_168;
  iVar12 = local_38 + curTexNdx;
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_248,-0.975,-0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_248,-0.81,-0.81);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_250,0.975,0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_250,0.8,0.8);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_258,1.3,1.25);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_258,1.0,1.0);
  }
  renderFaces(gl_00,&local_240,pTVar9,(ReferenceParams *)&texFmt,&this->m_renderer,iVar6,iVar12,
              iVar2,iVar3,&local_248,&local_250,&local_258);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar10 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_04,iVar3));
  tcu::SurfaceAccess::SurfaceAccess
            (&local_278,(Surface *)local_70,pPVar10,bottomHeight,curTexNdx,topHeight,local_168);
  ppTVar8 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,(long)local_16c);
  pTVar9 = glu::TextureCube::getRefTexture(*ppTVar8);
  iVar2 = topHeight;
  iVar3 = local_168;
  iVar12 = renderedFrame.m_pixels.m_cap._4_4_ + bottomHeight;
  iVar6 = local_38 + curTexNdx;
  tcu::Vector<float,_2>::Vector(&local_280,0.5,-0.65);
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_288,0.975,-0.975);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_288,0.8,-0.8);
  }
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    tcu::Vector<float,_2>::Vector(&local_290,1.1,1.06);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_290,1.0,1.0);
  }
  renderFaces(gl_00,&local_278,pTVar9,(ReferenceParams *)&texFmt,&this->m_renderer,iVar12,iVar6,
              iVar2,iVar3,&local_280,&local_288,&local_290);
  context = this->m_renderCtx;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&worstScoreDiff,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,renderedFrame.m_pixels.m_cap._4_4_,local_38,
                  (PixelBufferAccess *)&worstScoreDiff);
  score = 0x10;
  local_2c4[1] = 10000;
  local_2c4[0] = glu::TextureTestUtil::measureAccuracy
                           (log_00,(Surface *)local_70,(Surface *)&referenceFrame.m_pixels.m_cap,
                            0x10,10000);
  this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
  de::toString<int>(&local_2e8,local_2c4);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar7);
  std::__cxx11::string::~string((string *)&local_2e8);
  tcu::Surface::~Surface((Surface *)local_70);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

TextureCubeFilteringCase::IterateResult TextureCubeFilteringCase::iterate (void)
{
	const glw::Functions&		gl					= m_renderCtx.getFunctions();
	TestLog&					log					= m_testCtx.getLog();
	const int					cellSize			= 28;
	const int					defViewportWidth	= cellSize*6;
	const int					defViewportHeight	= cellSize*4;
	RandomViewport				viewport			(m_renderCtx.getRenderTarget(), cellSize*6, cellSize*4, deStringHash(getName()));
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);
	tcu::Surface				referenceFrame		(viewport.width, viewport.height);
	ReferenceParams				sampleParams		(TEXTURETYPE_CUBE);
	const tcu::TextureFormat&	texFmt				= m_textures[0]->getRefTexture().getFormat();
	tcu::TextureFormatInfo		fmtInfo				= tcu::getTextureFormatInfo(texFmt);

	// Accuracy measurements are off unless viewport size is exactly as expected.
	if (getNodeType() == tcu::NODETYPE_ACCURACY && (viewport.width < defViewportWidth || viewport.height < defViewportHeight))
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Viewport is divided into 4 sections.
	int				leftWidth			= viewport.width / 2;
	int				rightWidth			= viewport.width - leftWidth;
	int				bottomHeight		= viewport.height / 2;
	int				topHeight			= viewport.height - bottomHeight;

	int				curTexNdx			= 0;

	// Sampling parameters.
	sampleParams.sampler					= glu::mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	sampleParams.sampler.seamlessCubeMap	= true;
	sampleParams.samplerType				= getSamplerType(texFmt);
	sampleParams.colorBias					= fmtInfo.lookupBias;
	sampleParams.colorScale					= fmtInfo.lookupScale;
	sampleParams.lodMode					= LODMODE_EXACT;

	// Use unit 0.
	gl.activeTexture(GL_TEXTURE0);

	// Setup gradient texture.
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	// Bottom left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y, leftWidth, bottomHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Bottom right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, bottomHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y, rightWidth, bottomHeight,
				tcu::Vec2(0.5f, 0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, 0.8f) : tcu::Vec2(0.975f, 0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	if (m_textures.size() >= 2)
	{
		curTexNdx += 1;

		// Setup second texture.
		gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textures[curTexNdx]->getGLTexture());
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S,		m_wrapS);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T,		m_wrapT);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER,	m_minFilter);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	}

	// Top left: Minification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, bottomHeight, leftWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x, viewport.y+bottomHeight, leftWidth, topHeight,
				m_onlySampleFaceInterior ? tcu::Vec2(-0.81f, -0.81f) : tcu::Vec2(-0.975f, -0.975f),
				m_onlySampleFaceInterior ? tcu::Vec2( 0.8f,  0.8f) : tcu::Vec2( 0.975f,  0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.3f, 1.25f) : tcu::Vec2(1.0f, 1.0f));

	// Top right: Magnification
	renderFaces(gl,
				tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, bottomHeight, rightWidth, topHeight),
				m_textures[curTexNdx]->getRefTexture(), sampleParams,
				m_renderer,
				viewport.x+leftWidth, viewport.y+bottomHeight, rightWidth, topHeight,
				tcu::Vec2(0.5f, -0.65f), m_onlySampleFaceInterior ? tcu::Vec2(0.8f, -0.8f) : tcu::Vec2(0.975f, -0.975f),
				!m_onlySampleFaceInterior ? tcu::Vec2(1.1f, 1.06f) : tcu::Vec2(1.0f, 1.0f));

	// Read result.
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log.
	{
		const int	bestScoreDiff	= 16;
		const int	worstScoreDiff	= 10000;

		int score = measureAccuracy(log, referenceFrame, renderedFrame, bestScoreDiff, worstScoreDiff);
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::toString(score).c_str());
	}

	return STOP;
}